

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

string * PrintSize_abi_cxx11_(string *__return_storage_ptr__,uint64 file_size)

{
  undefined1 auVar1 [16];
  char *format;
  double dVar2;
  undefined1 in_ZMM0 [64];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (file_size < 0x40000001) {
    if (file_size < 0x100001) {
      dVar2 = (double)(long)file_size * 0.0009765625;
      format = "%.2f KB";
    }
    else {
      dVar2 = (double)(long)file_size * 9.5367431640625e-07;
      format = "%.2f MB";
    }
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,file_size);
    dVar2 = auVar1._0_8_ * 9.313225746154785e-10;
    format = "%.2f GB";
  }
  SStringPrintf(__return_storage_ptr__,format,dVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string PrintSize(uint64 file_size) {
  std::string res;
  if (file_size > GB) {
    SStringPrintf(&res, "%.2f GB", (double) file_size / GB);
  } else if (file_size > MB) {
    SStringPrintf(&res, "%.2f MB", (double) file_size / MB);
  } else {
    SStringPrintf(&res, "%.2f KB", (double) file_size / KB);
  }
  return res;
}